

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O3

bool duckdb::FilterCombiner::IsDenseRange(vector<duckdb::Value,_true> *in_list)

{
  pointer pVVar1;
  pointer pVVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  reference pvVar6;
  ulong uVar7;
  size_type __n;
  hugeint_t right;
  hugeint_t left;
  hugeint_t diff;
  hugeint_t local_50;
  hugeint_t local_40;
  
  bVar5 = true;
  if ((in_list->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (in_list->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar5 = false;
    pvVar6 = vector<duckdb::Value,_true>::operator[](in_list,0);
    bVar4 = LogicalType::IsIntegral(&pvVar6->type_);
    if (bVar4) {
      pVVar1 = (in_list->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar2 = (in_list->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pVVar1 != pVVar2) {
        uVar7 = (long)pVVar2 - (long)pVVar1 >> 6;
        lVar3 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        ::std::
        __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::Value*,std::vector<duckdb::Value,std::allocator<duckdb::Value>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pVVar1,pVVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        ::std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<duckdb::Value*,std::vector<duckdb::Value,std::allocator<duckdb::Value>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pVVar1);
      }
      pvVar6 = vector<duckdb::Value,_true>::operator[](in_list,0);
      right = Value::GetValue<duckdb::hugeint_t>(pvVar6);
      bVar5 = true;
      if (0x40 < (ulong)((long)(in_list->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                               ).super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(in_list->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                              .super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                              _M_impl.super__Vector_impl_data._M_start)) {
        __n = 1;
        do {
          pvVar6 = vector<duckdb::Value,_true>::operator[](in_list,__n);
          left = Value::GetValue<duckdb::hugeint_t>(pvVar6);
          bVar5 = TrySubtractOperator::
                  Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                            (left,right,&local_40);
          if (!bVar5) {
            return false;
          }
          hugeint_t::hugeint_t(&local_50,1);
          bVar5 = hugeint_t::operator!=(&local_40,&local_50);
        } while ((!bVar5) &&
                (__n = __n + 1, right = left,
                __n < (ulong)((long)(in_list->
                                    super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(in_list->
                                    super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 6)));
        bVar5 = !bVar5;
      }
    }
  }
  return bVar5;
}

Assistant:

ValueComparisonResult CompareValueInformation(ExpressionValueInformation &left, ExpressionValueInformation &right) {
	if (left.comparison_type == ExpressionType::COMPARE_EQUAL) {
		// left is COMPARE_EQUAL, we can either
		// (1) prune the right side or
		// (2) return UNSATISFIABLE
		bool prune_right_side = false;
		switch (right.comparison_type) {
		case ExpressionType::COMPARE_LESSTHAN:
			prune_right_side = left.constant < right.constant;
			break;
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
			prune_right_side = left.constant <= right.constant;
			break;
		case ExpressionType::COMPARE_GREATERTHAN:
			prune_right_side = left.constant > right.constant;
			break;
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
			prune_right_side = left.constant >= right.constant;
			break;
		case ExpressionType::COMPARE_NOTEQUAL:
			prune_right_side = left.constant != right.constant;
			break;
		default:
			D_ASSERT(right.comparison_type == ExpressionType::COMPARE_EQUAL);
			prune_right_side = left.constant == right.constant;
			break;
		}
		if (prune_right_side) {
			return ValueComparisonResult::PRUNE_RIGHT;
		} else {
			return ValueComparisonResult::UNSATISFIABLE_CONDITION;
		}
	} else if (right.comparison_type == ExpressionType::COMPARE_EQUAL) {
		// right is COMPARE_EQUAL
		return InvertValueComparisonResult(CompareValueInformation(right, left));
	} else if (left.comparison_type == ExpressionType::COMPARE_NOTEQUAL) {
		// left is COMPARE_NOTEQUAL, we can either
		// (1) prune the left side or
		// (2) not prune anything
		bool prune_left_side = false;
		switch (right.comparison_type) {
		case ExpressionType::COMPARE_LESSTHAN:
			prune_left_side = left.constant >= right.constant;
			break;
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
			prune_left_side = left.constant > right.constant;
			break;
		case ExpressionType::COMPARE_GREATERTHAN:
			prune_left_side = left.constant <= right.constant;
			break;
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
			prune_left_side = left.constant < right.constant;
			break;
		default:
			D_ASSERT(right.comparison_type == ExpressionType::COMPARE_NOTEQUAL);
			prune_left_side = left.constant == right.constant;
			break;
		}
		if (prune_left_side) {
			return ValueComparisonResult::PRUNE_LEFT;
		} else {
			return ValueComparisonResult::PRUNE_NOTHING;
		}
	} else if (right.comparison_type == ExpressionType::COMPARE_NOTEQUAL) {
		return InvertValueComparisonResult(CompareValueInformation(right, left));
	} else if (IsGreaterThan(left.comparison_type) && IsGreaterThan(right.comparison_type)) {
		// both comparisons are [>], we can either
		// (1) prune the left side or
		// (2) prune the right side
		if (left.constant > right.constant) {
			// left constant is more selective, prune right
			return ValueComparisonResult::PRUNE_RIGHT;
		} else if (left.constant < right.constant) {
			// right constant is more selective, prune left
			return ValueComparisonResult::PRUNE_LEFT;
		} else {
			// constants are equivalent
			// however we can still have the scenario where one is [>=] and the other is [>]
			// we want to prune the [>=] because [>] is more selective
			// if left is [>=] we prune the left, else we prune the right
			if (left.comparison_type == ExpressionType::COMPARE_GREATERTHANOREQUALTO) {
				return ValueComparisonResult::PRUNE_LEFT;
			} else {
				return ValueComparisonResult::PRUNE_RIGHT;
			}
		}
	} else if (IsLessThan(left.comparison_type) && IsLessThan(right.comparison_type)) {
		// both comparisons are [<], we can either
		// (1) prune the left side or
		// (2) prune the right side
		if (left.constant < right.constant) {
			// left constant is more selective, prune right
			return ValueComparisonResult::PRUNE_RIGHT;
		} else if (left.constant > right.constant) {
			// right constant is more selective, prune left
			return ValueComparisonResult::PRUNE_LEFT;
		} else {
			// constants are equivalent
			// however we can still have the scenario where one is [<=] and the other is [<]
			// we want to prune the [<=] because [<] is more selective
			// if left is [<=] we prune the left, else we prune the right
			if (left.comparison_type == ExpressionType::COMPARE_LESSTHANOREQUALTO) {
				return ValueComparisonResult::PRUNE_LEFT;
			} else {
				return ValueComparisonResult::PRUNE_RIGHT;
			}
		}
	} else if (IsLessThan(left.comparison_type)) {
		D_ASSERT(IsGreaterThan(right.comparison_type));
		// left is [<] and right is [>], in this case we can either
		// (1) prune nothing or
		// (2) return UNSATISFIABLE
		// the SMALLER THAN constant has to be greater than the BIGGER THAN constant
		if (left.constant >= right.constant) {
			return ValueComparisonResult::PRUNE_NOTHING;
		} else {
			return ValueComparisonResult::UNSATISFIABLE_CONDITION;
		}
	} else {
		// left is [>] and right is [<] or [!=]
		D_ASSERT(IsLessThan(right.comparison_type) && IsGreaterThan(left.comparison_type));
		return InvertValueComparisonResult(CompareValueInformation(right, left));
	}
}